

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint _c;
  pointer pMVar3;
  size_t _elemsize;
  void *pvVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  pointer pMVar9;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  void *__dest;
  long lVar16;
  bool bVar17;
  int local_a0;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar3->dims;
  _elemsize = pMVar3->elemsize;
  pvVar4 = (this->slices).data;
  if (uVar2 == 1) {
    pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar7 != 0) {
      iVar10 = pMVar3->w;
      uVar8 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = 0;
      lVar7 = 0;
      iVar14 = 0;
      uVar11 = 0;
      do {
        iVar15 = *(int *)((long)pvVar4 + uVar11 * 4);
        if (iVar15 == -0xe9) {
          iVar15 = (int)((ulong)((long)iVar10 - (long)iVar14) / (uVar8 + lVar7));
        }
        Mat::create((Mat *)((long)&pMVar9->data + lVar16),iVar15,_elemsize,opt->blob_allocator);
        pvVar12 = *(void **)((long)&pMVar9->data + lVar16);
        if (pvVar12 == (void *)0x0) {
          bVar17 = true;
        }
        else {
          bVar17 = (long)*(int *)((long)&pMVar9->c + lVar16) *
                   *(long *)((long)&pMVar9->cstep + lVar16) == 0;
        }
        if (bVar17) {
          return -100;
        }
        memcpy(pvVar12,(void *)((long)iVar14 * _elemsize + (long)pMVar3->data),
               (long)iVar15 * _elemsize);
        iVar14 = iVar15 + iVar14;
        uVar11 = uVar11 + 1;
        pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                -0x71c71c71c71c71c7;
        lVar7 = lVar7 + -1;
        lVar16 = lVar16 + 0x48;
      } while (uVar11 < uVar8);
    }
  }
  else {
    iVar10 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar10 == 0)) {
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar7 != 0) {
        iVar10 = pMVar3->w;
        iVar14 = pMVar3->h;
        uVar8 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
        lVar7 = 0;
        lVar16 = 0;
        iVar15 = 0;
        uVar11 = 0;
        do {
          iVar6 = *(int *)((long)pvVar4 + uVar11 * 4);
          if (iVar6 == -0xe9) {
            iVar6 = (int)((ulong)((long)iVar14 - (long)iVar15) / (uVar8 + lVar16));
          }
          Mat::create((Mat *)((long)&pMVar9->data + lVar7),iVar10,iVar6,_elemsize,
                      opt->blob_allocator);
          pvVar12 = *(void **)((long)&pMVar9->data + lVar7);
          if (pvVar12 == (void *)0x0) {
            bVar17 = true;
          }
          else {
            bVar17 = (long)*(int *)((long)&pMVar9->c + lVar7) *
                     *(long *)((long)&pMVar9->cstep + lVar7) == 0;
          }
          if (bVar17) {
            return -100;
          }
          memcpy(pvVar12,(void *)((long)iVar15 * (long)pMVar3->w * pMVar3->elemsize +
                                 (long)pMVar3->data),(long)(iVar6 * iVar10) * _elemsize);
          iVar15 = iVar6 + iVar15;
          uVar11 = uVar11 + 1;
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                  -0x71c71c71c71c71c7;
          lVar16 = lVar16 + -1;
          lVar7 = lVar7 + 0x48;
        } while (uVar11 < uVar8);
      }
    }
    else {
      if ((uVar2 != 2) || (iVar10 != 1)) {
        if ((uVar2 == 3) && (iVar10 == 0)) {
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
          if (lVar7 == 0) {
            return 0;
          }
          iVar10 = pMVar3->w;
          iVar14 = pMVar3->h;
          iVar15 = pMVar3->c;
          uVar8 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
          lVar16 = 0;
          lVar7 = 0;
          local_a0 = 0;
          uVar11 = 0;
          while( true ) {
            iVar6 = *(int *)((long)pvVar4 + uVar11 * 4);
            if (iVar6 == -0xe9) {
              iVar6 = (int)((ulong)((long)iVar15 - (long)local_a0) / (uVar8 + lVar7));
            }
            pMVar1 = (Mat *)((long)&pMVar9->data + lVar16);
            Mat::create(pMVar1,iVar10,iVar14,iVar6,_elemsize,opt->blob_allocator);
            if (*(long *)((long)&pMVar9->data + lVar16) == 0) {
              bVar17 = true;
            }
            else {
              bVar17 = (long)*(int *)((long)&pMVar9->c + lVar16) *
                       *(long *)((long)&pMVar9->cstep + lVar16) == 0;
            }
            if (bVar17) break;
            memcpy(pMVar1->data,
                   (void *)((long)local_a0 * pMVar3->cstep * pMVar3->elemsize + (long)pMVar3->data),
                   (long)(iVar6 * (int)pMVar3->cstep) * _elemsize);
            local_a0 = iVar6 + local_a0;
            uVar11 = uVar11 + 1;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                    -0x71c71c71c71c71c7;
            lVar7 = lVar7 + -1;
            lVar16 = lVar16 + 0x48;
            if (uVar8 <= uVar11) {
              return 0;
            }
          }
        }
        else if ((uVar2 == 3) && (iVar10 == 1)) {
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
          if (lVar7 == 0) {
            return 0;
          }
          iVar10 = pMVar3->w;
          uVar2 = pMVar3->c;
          iVar14 = pMVar3->h;
          uVar8 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
          uVar11 = 0;
          iVar15 = 0;
          while( true ) {
            iVar6 = *(int *)((long)pvVar4 + uVar11 * 4);
            if (iVar6 == -0xe9) {
              iVar6 = (int)((ulong)((long)iVar14 - (long)iVar15) / (uVar8 - uVar11));
            }
            pMVar1 = pMVar9 + uVar11;
            Mat::create(pMVar1,iVar10,iVar6,uVar2,_elemsize,opt->blob_allocator);
            if (pMVar1->data == (void *)0x0) {
              bVar17 = true;
            }
            else {
              bVar17 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar17) {
              if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  memcpy((void *)(pMVar1->cstep * uVar8 * pMVar1->elemsize + (long)pMVar1->data),
                         (void *)((long)pMVar3->data +
                                 (long)pMVar3->w * (long)iVar15 * pMVar3->elemsize +
                                 pMVar3->cstep * uVar8 * pMVar3->elemsize),
                         (long)(iVar6 * iVar10) * _elemsize);
                  uVar8 = uVar8 + 1;
                } while (uVar2 != uVar8);
              }
              iVar15 = iVar15 + iVar6;
            }
            if (bVar17) break;
            uVar11 = uVar11 + 1;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                    -0x71c71c71c71c71c7;
            if (uVar8 <= uVar11) {
              return 0;
            }
          }
        }
        else {
          if (uVar2 != 3) {
            return 0;
          }
          if (iVar10 != 2) {
            return 0;
          }
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9;
          if (lVar7 == 0) {
            return 0;
          }
          iVar10 = pMVar3->w;
          uVar2 = pMVar3->h;
          _c = pMVar3->c;
          uVar8 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
          uVar11 = 0;
          iVar14 = 0;
          while( true ) {
            iVar15 = *(int *)((long)pvVar4 + uVar11 * 4);
            if (iVar15 == -0xe9) {
              iVar15 = (int)((ulong)((long)iVar10 - (long)iVar14) / (uVar8 - uVar11));
            }
            pMVar1 = pMVar9 + uVar11;
            Mat::create(pMVar1,iVar15,uVar2,_c,_elemsize,opt->blob_allocator);
            if (pMVar1->data == (void *)0x0) {
              bVar17 = true;
            }
            else {
              bVar17 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar17) {
              if (0 < (int)_c) {
                uVar8 = 0;
                do {
                  if (0 < (int)uVar2) {
                    iVar6 = pMVar3->w;
                    sVar5 = pMVar3->elemsize;
                    __dest = (void *)(pMVar1->cstep * uVar8 * pMVar1->elemsize + (long)pMVar1->data)
                    ;
                    pvVar12 = (void *)((long)pMVar3->data +
                                      sVar5 * pMVar3->cstep * uVar8 + (long)iVar14 * _elemsize);
                    uVar13 = (ulong)uVar2;
                    do {
                      memcpy(__dest,pvVar12,(long)iVar15 * _elemsize);
                      __dest = (void *)((long)__dest + (long)iVar15 * _elemsize);
                      pvVar12 = (void *)((long)pvVar12 + (long)iVar6 * sVar5);
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 != _c);
              }
              iVar14 = iVar14 + iVar15;
            }
            if (bVar17) break;
            uVar11 = uVar11 + 1;
            pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                    -0x71c71c71c71c71c7;
            if (uVar8 <= uVar11) {
              return 0;
            }
          }
        }
        return -100;
      }
      pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar9;
      if (lVar7 != 0) {
        iVar10 = pMVar3->w;
        uVar2 = pMVar3->h;
        uVar8 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
        iVar14 = 0;
        uVar11 = 0;
        do {
          iVar15 = *(int *)((long)pvVar4 + uVar11 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar10 - (long)iVar14) / (uVar8 - uVar11));
          }
          pMVar1 = pMVar9 + uVar11;
          Mat::create(pMVar1,iVar15,uVar2,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            bVar17 = true;
          }
          else {
            bVar17 = (long)pMVar1->c * pMVar1->cstep == 0;
          }
          if (!bVar17) {
            if (0 < (int)uVar2) {
              uVar8 = 0;
              do {
                memcpy((void *)((long)pMVar1->w * uVar8 * pMVar1->elemsize + (long)pMVar1->data),
                       (void *)((long)pMVar3->data +
                               (long)iVar14 * _elemsize + (long)pMVar3->w * uVar8 * pMVar3->elemsize
                               ),(long)iVar15 * _elemsize);
                uVar8 = uVar8 + 1;
              } while (uVar2 != uVar8);
            }
            iVar14 = iVar14 + iVar15;
          }
          if (bVar17) {
            return -100;
          }
          uVar11 = uVar11 + 1;
          pMVar9 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                  -0x71c71c71c71c71c7;
        } while (uVar11 < uVar8);
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}